

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Requirement.cpp
# Opt level: O0

void __thiscall
Requirement::Requirement(Requirement *this,string *shiftType,string *skill,json *daysRequirements)

{
  Scenario *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  ulong uVar1;
  size_type sVar2;
  const_reference __rhs;
  const_reference other;
  reference pvVar3;
  int local_b8;
  int local_b4;
  DayRequirement local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  json j;
  int i;
  string requirementTxt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  DaysOfTheWeekVector;
  json *daysRequirements_local;
  string *skill_local;
  string *shiftType_local;
  Requirement *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->skill);
  std::vector<DayRequirement,_std::allocator<DayRequirement>_>::vector(&this->days);
  std::__cxx11::string::operator=((string *)this,(string *)shiftType);
  std::__cxx11::string::operator=((string *)&this->skill,(string *)skill);
  this_00 = Scenario::getInstance();
  __x = Scenario::getDaysOfTheWeekVector_abi_cxx11_(this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&requirementTxt.field_2 + 8),__x);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i,"requirementOn",(allocator *)((long)&j.m_value + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&j.m_value + 7));
  j.m_value.number_integer._0_4_ = 0;
  while( true ) {
    uVar1 = (ulong)(int)j.m_value.number_integer._0_4_;
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&requirementTxt.field_2 + 8));
    if (sVar2 <= uVar1) break;
    __rhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&requirementTxt.field_2 + 8),(long)(int)j.m_value.number_integer._0_4_);
    std::operator+(&local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i
                   ,__rhs);
    other = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::operator[](daysRequirements,&local_a8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_88,other);
    std::__cxx11::string::~string((string *)&local_a8);
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_88,"minimum");
    local_b4 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::get<int,_int,_0>(pvVar3);
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_88,"optimal");
    local_b8 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::get<int,_int,_0>(pvVar3);
    DayRequirement::DayRequirement(&local_b0,&local_b4,&local_b8);
    std::vector<DayRequirement,_std::allocator<DayRequirement>_>::push_back(&this->days,&local_b0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)local_88);
    j.m_value.number_integer._0_4_ = j.m_value.number_integer._0_4_ + 1;
  }
  std::__cxx11::string::~string((string *)&i);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&requirementTxt.field_2 + 8));
  return;
}

Assistant:

Requirement::Requirement(string shiftType, string skill, const json &daysRequirements) {
    this->shiftType = shiftType;
    this->skill = skill;

    const vector<string> DaysOfTheWeekVector = Scenario::getInstance()->getDaysOfTheWeekVector();

    string requirementTxt = "requirementOn";

    for (int i = 0; i < DaysOfTheWeekVector.size(); i++) {
        json j = daysRequirements[requirementTxt + DaysOfTheWeekVector.at(i)];
        days.push_back(DayRequirement(
                j["minimum"].get<int>(),
                j["optimal"].get<int>()));
    }
}